

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringalgorithms_p.h
# Opt level: O0

TrimPositions QStringAlgorithms<const_QLatin1String>::trimmed_helper_positions(QLatin1String *str)

{
  TrimPositions TVar1;
  Char *end;
  Char *begin;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 in_stack_ffffffffffffffd7;
  bool bVar2;
  const_iterator local_28;
  const_iterator local_20;
  
  local_20 = QLatin1String::cbegin((QLatin1String *)0x53b417);
  local_28 = QLatin1String::cend((QLatin1String *)
                                 CONCAT17(in_stack_ffffffffffffffd7,
                                          CONCAT16(in_stack_ffffffffffffffd6,
                                                   in_stack_ffffffffffffffd0)));
  while( true ) {
    bVar2 = false;
    if (local_20 < local_28) {
      bVar2 = isSpace('\0');
    }
    if (bVar2 == false) break;
    local_28 = local_28 + -1;
  }
  while( true ) {
    bVar2 = false;
    if (local_20 < local_28) {
      bVar2 = isSpace('\0');
    }
    if (bVar2 == false) break;
    local_20 = local_20 + 1;
  }
  TVar1.end = local_28;
  TVar1.begin = local_20;
  return TVar1;
}

Assistant:

[[nodiscard]] static TrimPositions trimmed_helper_positions(const StringType &str)
    {
        const Char *begin = str.cbegin();
        const Char *end = str.cend();
        // skip white space from end
        while (begin < end && isSpace(end[-1]))
            --end;
        // skip white space from start
        while (begin < end && isSpace(*begin))
            begin++;
        return {begin, end};
    }